

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>,void>
               (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                *container,ostream *os)

{
  bool bVar1;
  reference value;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *container_local;
  
  std::operator<<(os,'{');
  __range3 = (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              *)0x0;
  __end0 = std::
           vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
           ::begin(container);
  elem = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
         std::
         vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
         ::end(container);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
                      (&__end0,(__normal_iterator<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
                                *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0052e2c7:
      if (__range3 !=
          (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
           *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
            ::operator*(&__end0);
    if ((__range3 !=
         (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
          *)0x0) &&
       (std::operator<<(os,','),
       __range3 ==
       (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
        *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_0052e2c7;
    }
    std::operator<<(os,' ');
    UniversalPrint<std::__cxx11::u16string>(value,os);
    __range3 = (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                *)((long)&(__range3->
                          super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }